

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reservoir_quantile.cpp
# Opt level: O1

void __thiscall
duckdb::ReservoirQuantileState<short>::FillReservoir
          (ReservoirQuantileState<short> *this,idx_t sample_size,short element)

{
  ulong uVar1;
  BaseReservoirSampling *this_00;
  
  uVar1 = this->pos;
  if (uVar1 < sample_size) {
    this->pos = uVar1 + 1;
    this->v[uVar1] = element;
    BaseReservoirSampling::InitializeReservoirWeights(this->r_samp,uVar1 + 1,this->len);
    return;
  }
  this_00 = this->r_samp;
  if (this_00->next_index_to_sample == this_00->num_entries_to_skip_b4_next_sample) {
    this->v[this_00->min_weighted_entry_index] = element;
    BaseReservoirSampling::ReplaceElement(this_00,-1.0);
    return;
  }
  return;
}

Assistant:

void FillReservoir(idx_t sample_size, T element) {
		if (pos < sample_size) {
			v[pos++] = element;
			r_samp->InitializeReservoirWeights(pos, len);
		} else {
			D_ASSERT(r_samp->next_index_to_sample >= r_samp->num_entries_to_skip_b4_next_sample);
			if (r_samp->next_index_to_sample == r_samp->num_entries_to_skip_b4_next_sample) {
				ReplaceElement(element);
			}
		}
	}